

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle * ures_copyResb_63(UResourceBundle *r,UResourceBundle *original,UErrorCode *status)

{
  UBool UVar1;
  UBool local_29;
  UBool isStackObject;
  UErrorCode *status_local;
  UResourceBundle *original_local;
  UResourceBundle *r_local;
  
  UVar1 = U_FAILURE(*status);
  r_local = r;
  if ((UVar1 == '\0') && (r != original)) {
    original_local = r;
    if (original != (UResourceBundle *)0x0) {
      if (r == (UResourceBundle *)0x0) {
        local_29 = '\0';
        original_local = (UResourceBundle *)uprv_malloc_63(200);
        if (original_local == (UResourceBundle *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          return (UResourceBundle *)0x0;
        }
      }
      else {
        local_29 = ures_isStackObject(r);
        ures_closeBundle(r,'\0');
      }
      memcpy(original_local,original,200);
      original_local->fResPath = (char *)0x0;
      original_local->fResPathLen = 0;
      if (original->fResPath != (char *)0x0) {
        ures_appendResPath(original_local,original->fResPath,original->fResPathLen,status);
      }
      ures_setIsStackObject(original_local,local_29);
      if (original_local->fData != (UResourceDataEntry *)0x0) {
        entryIncrease(original_local->fData);
      }
    }
    r_local = original_local;
  }
  return r_local;
}

Assistant:

UResourceBundle *ures_copyResb(UResourceBundle *r, const UResourceBundle *original, UErrorCode *status) {
    UBool isStackObject;
    if(U_FAILURE(*status) || r == original) {
        return r;
    }
    if(original != NULL) {
        if(r == NULL) {
            isStackObject = FALSE;
            r = (UResourceBundle *)uprv_malloc(sizeof(UResourceBundle));
            /* test for NULL */
            if (r == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                return NULL;
            }
        } else {
            isStackObject = ures_isStackObject(r);
            ures_closeBundle(r, FALSE);
        }
        uprv_memcpy(r, original, sizeof(UResourceBundle));
        r->fResPath = NULL;
        r->fResPathLen = 0;
        if(original->fResPath) {
            ures_appendResPath(r, original->fResPath, original->fResPathLen, status);
        }
        ures_setIsStackObject(r, isStackObject);
        if(r->fData != NULL) {
            entryIncrease(r->fData);
        }
    }
    return r;
}